

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O2

QGraphicsItem * __thiscall QGraphicsItem::mapFromParent(QGraphicsItem *this,QPainterPath *path)

{
  QGraphicsItemPrivate *this_00;
  QPointF *in_RDX;
  long in_FS_OFFSET;
  QTransform QStack_c8;
  undefined4 local_78;
  uint uStack_74;
  undefined4 uStack_70;
  uint uStack_6c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsItemPrivate **)(path + 8);
  if (this_00->transformData == (TransformData *)0x0) {
    local_78 = *(undefined4 *)&(this_00->pos).xp;
    uStack_70 = *(undefined4 *)&(this_00->pos).yp;
    uStack_74 = *(uint *)((long)&(this_00->pos).xp + 4) ^ 0x80000000;
    uStack_6c = *(uint *)((long)&(this_00->pos).yp + 4) ^ 0x80000000;
    QPainterPath::translated((QPainterPath *)this,in_RDX);
  }
  else {
    QGraphicsItemPrivate::transformToParent(&QStack_c8,this_00);
    QTransform::inverted((bool *)&local_78);
    QTransform::map((QPainterPath *)this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPainterPath QGraphicsItem::mapFromParent(const QPainterPath &path) const
{
    // COMBINE
    if (!d_ptr->transformData)
            return path.translated(-d_ptr->pos);
    return d_ptr->transformToParent().inverted().map(path);
}